

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O0

int Gia_ManAreCubeCheckTree_rec(Gia_ManAre_t *p,Gia_ObjAre_t *pObj,Gia_StaAre_t *pSta)

{
  int iVar1;
  Gia_ObjAre_t *pGVar2;
  int local_2c;
  int RetValue;
  Gia_StaAre_t *pSta_local;
  Gia_ObjAre_t *pObj_local;
  Gia_ManAre_t *p_local;
  
  iVar1 = Gia_StaHasValue0(pSta,*(uint *)pObj & 0x3fff);
  if (iVar1 == 0) {
    iVar1 = Gia_StaHasValue1(pSta,*(uint *)pObj & 0x3fff);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjHasBranch1(pObj);
      if (iVar1 == 0) {
        local_2c = Gia_ManAreCubeCheckList(p,pObj->F + 1,pSta);
      }
      else {
        pGVar2 = Gia_ObjNextObj1(p,pObj);
        local_2c = Gia_ManAreCubeCheckTree_rec(p,pGVar2,pSta);
      }
      if (local_2c == 0) {
        return 0;
      }
    }
  }
  else {
    iVar1 = Gia_ObjHasBranch0(pObj);
    if (iVar1 == 0) {
      local_2c = Gia_ManAreCubeCheckList(p,pObj->F,pSta);
    }
    else {
      pGVar2 = Gia_ObjNextObj0(p,pObj);
      local_2c = Gia_ManAreCubeCheckTree_rec(p,pGVar2,pSta);
    }
    if (local_2c == 0) {
      return 0;
    }
  }
  iVar1 = Gia_ObjHasBranch2(pObj);
  if (iVar1 == 0) {
    p_local._4_4_ = Gia_ManAreCubeCheckList(p,pObj->F + 2,pSta);
  }
  else {
    pGVar2 = Gia_ObjNextObj2(p,pObj);
    p_local._4_4_ = Gia_ManAreCubeCheckTree_rec(p,pGVar2,pSta);
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManAreCubeCheckTree_rec( Gia_ManAre_t * p, Gia_ObjAre_t * pObj, Gia_StaAre_t * pSta )
{
    int RetValue;
    if ( Gia_StaHasValue0(pSta, pObj->iVar) )
    {
        if ( Gia_ObjHasBranch0(pObj) )
            RetValue = Gia_ManAreCubeCheckTree_rec( p, Gia_ObjNextObj0(p, pObj), pSta );
        else
            RetValue = Gia_ManAreCubeCheckList( p, pObj->F, pSta );
        if ( RetValue == 0 )
            return 0;
    }
    else if ( Gia_StaHasValue1(pSta, pObj->iVar) )
    {
        if ( Gia_ObjHasBranch1(pObj) )
            RetValue = Gia_ManAreCubeCheckTree_rec( p, Gia_ObjNextObj1(p, pObj), pSta );
        else
            RetValue = Gia_ManAreCubeCheckList( p, pObj->F + 1, pSta );
        if ( RetValue == 0 )
            return 0;
    }
    if ( Gia_ObjHasBranch2(pObj) )
        return Gia_ManAreCubeCheckTree_rec( p, Gia_ObjNextObj2(p, pObj), pSta );
    return Gia_ManAreCubeCheckList( p, pObj->F + 2, pSta );
}